

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O3

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calcCrossProductsPartials
          (BeagleCPUImpl<double,_1,_0> *this,double *postOrderPartial,double *preOrderPartial,
          double *categoryRates,double *categoryWeights,double edgeLength,double *outCrossProducts,
          double *outSumSquaredDerivatives)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  int iVar5;
  int iVar6;
  BeagleCPUImpl<double,_1,_0> *pBVar7;
  ulong uVar8;
  pointer pdVar9;
  ulong uVar10;
  long lVar11;
  double *pdVar12;
  double *pdVar13;
  long lVar14;
  long lVar15;
  int j_1;
  ulong uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [64];
  undefined1 auVar23 [16];
  double dVar24;
  undefined1 auVar25 [16];
  vector<double,_std::allocator<double>_> tmp;
  allocator_type local_91;
  long local_90;
  BeagleCPUImpl<double,_1,_0> *local_88;
  long local_80;
  double *local_78;
  double *local_70;
  double *local_68;
  double local_60;
  double *local_58;
  value_type_conflict local_50;
  vector<double,_std::allocator<double>_> local_48;
  
  if (0 < this->kPatternCount) {
    local_80 = 0;
    local_90 = 0;
    local_88 = this;
    local_78 = preOrderPartial;
    local_70 = postOrderPartial;
    local_68 = outCrossProducts;
    local_60 = edgeLength;
    local_58 = categoryRates;
    do {
      local_50 = 0.0;
      std::vector<double,_std::allocator<double>_>::vector
                (&local_48,(ulong)(uint)(this->kStateCount * this->kStateCount),&local_50,&local_91)
      ;
      pBVar7 = local_88;
      uVar4 = this->kStateCount;
      iVar5 = this->kCategoryCount;
      dVar24 = 0.0;
      uVar8 = (ulong)uVar4;
      if (0 < (long)iVar5) {
        auVar22 = ZEXT864(0) << 0x40;
        lVar15 = 0;
        iVar6 = local_88->kPatternCount;
        lVar11 = (long)local_88->kPartialsPaddedStateCount;
        lVar14 = iVar6 * lVar11;
        pdVar13 = (double *)((long)local_70 + local_80 * lVar11);
        pdVar12 = (double *)(local_80 * lVar11 + (long)local_78);
        do {
          dVar24 = categoryWeights[lVar15];
          auVar18._8_8_ = 0;
          auVar18._0_8_ = dVar24;
          if ((int)uVar4 < 1) {
            auVar18 = vfmadd213sd_fma(auVar18,ZEXT816(0) << 0x40,auVar22._0_16_);
          }
          else {
            auVar25 = ZEXT816(0) << 0x40;
            dVar1 = local_58[lVar15];
            uVar10 = 0;
            do {
              auVar23._8_8_ = 0;
              auVar23._0_8_ = pdVar13[uVar10];
              auVar2._8_8_ = 0;
              auVar2._0_8_ = pdVar12[uVar10];
              auVar25 = vfmadd231sd_fma(auVar25,auVar23,auVar2);
              uVar10 = uVar10 + 1;
            } while (uVar8 != uVar10);
            auVar18 = vfmadd213sd_fma(auVar25,auVar18,auVar22._0_16_);
            if (0 < (int)uVar4) {
              uVar10 = 0;
              pdVar9 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              do {
                uVar16 = 0;
                do {
                  auVar25._8_8_ = 0;
                  auVar25._0_8_ = pdVar9[uVar16];
                  auVar20._8_8_ = 0;
                  auVar20._0_8_ = local_60 * dVar1;
                  auVar21._8_8_ = 0;
                  auVar21._0_8_ =
                       dVar24 * local_78[(lVar15 * iVar6 + local_90) * lVar11 + uVar10] *
                                pdVar13[uVar16];
                  auVar25 = vfmadd213sd_fma(auVar21,auVar20,auVar25);
                  pdVar9[uVar16] = auVar25._0_8_;
                  uVar16 = uVar16 + 1;
                } while (uVar8 != uVar16);
                uVar10 = uVar10 + 1;
                pdVar9 = pdVar9 + (int)uVar4;
              } while (uVar10 != uVar8);
            }
          }
          dVar24 = auVar18._0_8_;
          lVar15 = lVar15 + 1;
          pdVar13 = pdVar13 + lVar14;
          pdVar12 = pdVar12 + lVar14;
          auVar22 = ZEXT1664(auVar18);
        } while (lVar15 != iVar5);
      }
      if ((int)uVar4 < 1) {
        if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) goto LAB_00129c0b;
      }
      else {
        uVar10 = 0;
        auVar17._0_8_ = local_88->gPatternWeights[local_90] / dVar24;
        auVar17._8_8_ = 0;
        pdVar9 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar12 = local_68;
        do {
          uVar16 = 0;
          do {
            auVar19._8_8_ = 0;
            auVar19._0_8_ = pdVar9[uVar16];
            auVar3._8_8_ = 0;
            auVar3._0_8_ = pdVar12[uVar16];
            auVar18 = vfmadd213sd_fma(auVar19,auVar17,auVar3);
            pdVar12[uVar16] = auVar18._0_8_;
            uVar16 = uVar16 + 1;
          } while (uVar8 != uVar16);
          uVar10 = uVar10 + 1;
          pdVar12 = pdVar12 + uVar8;
          pdVar9 = pdVar9 + uVar8;
        } while (uVar10 != uVar8);
LAB_00129c0b:
        operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      local_80 = local_80 + 8;
      local_90 = local_90 + 1;
      this = pBVar7;
    } while (local_90 < pBVar7->kPatternCount);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcCrossProductsPartials(const REALTYPE *postOrderPartial,
                                                                  const REALTYPE *preOrderPartial,
                                                                  const double *categoryRates,
                                                                  const REALTYPE *categoryWeights,
                                                                  const double edgeLength,
                                                                  double *outCrossProducts,
                                                                  double *outSumSquaredDerivatives) {

    for (int pattern = 0; pattern < kPatternCount; pattern++) {

        std::vector<REALTYPE> tmp(kStateCount * kStateCount, 0.0); // TODO Handle temporary memory better

        REALTYPE patternDenominator = 0.0;

        for (int category = 0; category < kCategoryCount; category++) {

            const REALTYPE scale = (REALTYPE) categoryRates[category] * edgeLength;

            const REALTYPE weight = categoryWeights[category];
            const int patternIndex = category * kPatternCount + pattern; // Bad memory access
            const int v = patternIndex * kPartialsPaddedStateCount;

            REALTYPE denominator = 0.0;
            for (int k = 0; k < kStateCount; k++) {
                denominator += postOrderPartial[v + k] * preOrderPartial[v + k];
            }
            patternDenominator += denominator * weight;

            for (int k = 0; k < kStateCount; k++) {
                for (int j = 0; j < kStateCount; j++) {
                    tmp[k * kStateCount + j] += preOrderPartial[v + k] * postOrderPartial[v + j] * weight * scale;
                }
            }
        }

        const auto patternWeight = gPatternWeights[pattern] / patternDenominator;
        for (int k = 0; k < kStateCount; k++) {
            for (int j = 0; j < kStateCount; j++) {
                outCrossProducts[k * kStateCount + j] += tmp[k * kStateCount + j] * patternWeight;
            }
        }
    }
}